

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getInitialization_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this)

{
  GLchar *__s;
  TestError *this_00;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  uint local_3fc;
  undefined1 local_3f8 [4];
  GLuint i_6;
  string local_3d8;
  string local_3b8;
  uint local_394;
  undefined1 local_390 [4];
  GLuint i_5;
  string local_370;
  uint local_34c;
  undefined1 local_348 [4];
  GLuint i_4;
  string local_328;
  string local_308;
  uint local_2e4;
  undefined1 local_2e0 [4];
  GLuint i_3;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  uint local_1bc;
  undefined1 local_1b8 [4];
  GLuint i_2;
  uint local_194;
  uint local_190;
  GLuint col;
  GLuint i_1;
  GLuint *local_168;
  string *type_name;
  uint local_13c;
  undefined1 local_138 [4];
  GLuint i;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_48;
  undefined1 local_21;
  reference local_20;
  testCase *test_case;
  InitializerListTest *this_local;
  string *initialization;
  
  test_case = (testCase *)this;
  this_local = (InitializerListTest *)__return_storage_ptr__;
  local_20 = std::
             vector<gl4cts::GLSL420Pack::InitializerListTest::testCase,_std::allocator<gl4cts::GLSL420Pack::InitializerListTest::testCase>_>
             ::operator[](&this->m_test_cases,(long)this->m_current_test_case_index);
  local_21 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(local_20->m_initializer) {
  case VECTOR:
    getVectorInitializer_abi_cxx11_(&local_48,this,0,local_20->m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_48);
    break;
  case MATRIX:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ ");
    getVectorArrayList_abi_cxx11_(&local_78,this,local_20->m_n_cols,local_20->m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case MATRIX_ROWS:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ ");
    getVectorArrayCtr_abi_cxx11_(&local_98,this,local_20->m_n_cols,local_20->m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case STRUCT:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ ");
    getVectorInitializer_abi_cxx11_(&local_b8,this,0,local_20->m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_d8,this,2,local_20->m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case ARRAY_SCALAR:
  case UNSIZED_ARRAY_SCALAR:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ ");
    getVectorValues_abi_cxx11_(&local_f8,this,0,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case ARRAY_VECTOR_CTR:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ ");
    getVectorArrayCtr_abi_cxx11_((string *)local_138,this,4,local_20->m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case ARRAY_VECTOR_LIST:
  case UNSIZED_ARRAY_VECTOR:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ ");
    getVectorArrayList_abi_cxx11_(&local_118,this,4,local_20->m_n_rows);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case ARRAY_MATRIX_CTR:
    __s = Utils::getTypeName(FLOAT,local_20->m_n_cols,local_20->m_n_rows);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&i_1,__s,(allocator<char> *)((long)&col + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&col + 3));
    local_168 = &i_1;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ ");
    for (local_190 = 0; local_190 < 4; local_190 = local_190 + 1) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      for (local_194 = 0; local_194 < local_20->m_n_cols; local_194 = local_194 + 1) {
        getVectorValues_abi_cxx11_((string *)local_1b8,this,local_194,local_20->m_n_rows);
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)local_1b8);
        if (local_194 + 1 < local_20->m_n_cols) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (local_190 + 1 < 4) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&i_1);
    break;
  case ARRAY_MATRIX_LIST:
  case UNSIZED_ARRAY_MATRIX:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ ");
    for (local_13c = 0; local_13c < 4; local_13c = local_13c + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorArrayList_abi_cxx11_((string *)&type_name,this,local_20->m_n_cols,local_20->m_n_rows)
      ;
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&type_name);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (local_13c + 1 < 4) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case ARRAY_STRUCT:
  case UNSIZED_ARRAY_STRUCT:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ ");
    for (local_1bc = 0; local_1bc < 4; local_1bc = local_1bc + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_1e0,this,0,local_20->m_n_rows);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_200,this,2,local_20->m_n_rows);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (local_1bc + 1 < 4) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case NESTED_STRUCT_CTR:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"StructureWithStructure(BasicStructure(");
    getVectorConstructor_abi_cxx11_(&local_220,this,0,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_240,this,2,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_240);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_260,this,3,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case NESTED_STRUCT_LIST:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ { ");
    getVectorInitializer_abi_cxx11_(&local_280,this,0,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_2a0,this,2,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_2c0,this,3,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_LIST:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ ");
    getVectorInitializer_abi_cxx11_((string *)local_2e0,this,0,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)local_2e0);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (local_2e4 = 0; local_2e4 < 3; local_2e4 = local_2e4 + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_308,this,2,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_308);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_328,this,3,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_328);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (local_2e4 + 1 < 3) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case NESTED_STURCT_ARRAYS_STRUCT_MIX:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ ");
    getVectorConstructor_abi_cxx11_((string *)local_348,this,0,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)local_348);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    for (local_34c = 0; local_34c < 3; local_34c = local_34c + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_370,this,2,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_370);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorConstructor_abi_cxx11_((string *)local_390,this,3,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_390);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (local_34c + 1 < 3) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case NESTED_ARRAY_STRUCT_STRUCT_LIST:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ ");
    for (local_394 = 0; local_394 < 4; local_394 = local_394 + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_3b8,this,0,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_3d8,this,1,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_((string *)local_3f8,this,2,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)local_3f8);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (local_394 + 1 < 4) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case NESTED_ARRAY_STRUCT_STRUCT_MIX:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{\n");
    for (local_3fc = 0; local_3fc < 2; local_3fc = local_3fc + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorConstructor_abi_cxx11_(&local_420,this,0,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_420);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorConstructor_abi_cxx11_(&local_440,this,1,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_440);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorConstructor_abi_cxx11_(&local_460,this,2,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_460);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_480,this,0,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_480);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_4a0,this,1,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_4a0);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      getVectorInitializer_abi_cxx11_(&local_4c0,this,2,4);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (local_3fc + 1 < 2) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case NESTED_STRUCT_STRUCT_ARRAY_LIST:
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"{ ");
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_4e0,this,0,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_500,this,1,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_520,this,2,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorInitializer_abi_cxx11_(&local_540,this,3,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  case NESTED_STRUCT_STRUCT_ARRAY_MIX:
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,"StructureWithStructureWithArray(");
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_560,this,0,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_580,this,1,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_5a0,this,2,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    getVectorConstructor_abi_cxx11_(&local_5c0,this,3,4);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
               ,0x3721);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getInitialization()
{
	const testCase& test_case = m_test_cases[m_current_test_case_index];

	std::string initialization;

	switch (test_case.m_initializer)
	{
	case VECTOR:
		initialization.append(getVectorInitializer(0 /*column*/, test_case.m_n_rows));

		break;

	case MATRIX:
		initialization = "{ ";
		initialization.append(getVectorArrayList(test_case.m_n_cols, test_case.m_n_rows));
		initialization.append(" }");

		break;

	case MATRIX_ROWS:
	{
		initialization = "{ ";
		initialization.append(getVectorArrayCtr(test_case.m_n_cols, test_case.m_n_rows));
		initialization.append(" }");
	}
	break;

	case STRUCT:
		initialization = "{ ";
		initialization.append(getVectorInitializer(0 /* column */, test_case.m_n_rows));
		initialization.append(", ");
		initialization.append(getVectorInitializer(2 /* column */, test_case.m_n_rows));
		initialization.append(" }");

		break;

	case ARRAY_SCALAR:
	case UNSIZED_ARRAY_SCALAR:
		initialization = "{ ";
		initialization.append(getVectorValues(0 /* column */, 4 /* size */));
		initialization.append(" }");

		break;

	case ARRAY_VECTOR_LIST:
	case UNSIZED_ARRAY_VECTOR:
		initialization = "{ ";
		initialization.append(getVectorArrayList(4 /* columns */, test_case.m_n_rows));
		initialization.append(" }");

		break;

	case ARRAY_VECTOR_CTR:
		initialization = "{ ";
		initialization.append(getVectorArrayCtr(4 /* columns */, test_case.m_n_rows));
		initialization.append(" }");

		break;

	case ARRAY_MATRIX_LIST:
	case UNSIZED_ARRAY_MATRIX:
		initialization = "{ ";

		for (GLuint i = 0; i < 4; ++i)
		{
			initialization.append("{ ");
			initialization.append(getVectorArrayList(test_case.m_n_cols, test_case.m_n_rows));
			initialization.append(" }");

			if (i + 1 < 4)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" }");

		break;

	case ARRAY_MATRIX_CTR:
	{
		const std::string& type_name = Utils::getTypeName(Utils::FLOAT, test_case.m_n_cols, test_case.m_n_rows);

		initialization = "{ ";

		for (GLuint i = 0; i < 4; ++i)
		{
			initialization.append(type_name);
			initialization.append("(");
			for (GLuint col = 0; col < test_case.m_n_cols; ++col)
			{
				initialization.append(getVectorValues(col, test_case.m_n_rows));

				if (col + 1 < test_case.m_n_cols)
				{
					initialization.append(", ");
				}
			}
			initialization.append(")");

			if (i + 1 < 4)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" }");
	}
	break;

	case ARRAY_STRUCT:
	case UNSIZED_ARRAY_STRUCT:
		initialization = "{ ";

		for (GLuint i = 0; i < 4; ++i)
		{
			initialization.append("{ ");
			initialization.append(getVectorInitializer(0 /* column */, test_case.m_n_rows));
			initialization.append(", ");
			initialization.append(getVectorInitializer(2 /* column */, test_case.m_n_rows));
			initialization.append(" }");

			if (i + 1 < 4)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" }");

		break;

	case NESTED_STRUCT_CTR:
		initialization = "StructureWithStructure(BasicStructure(";
		initialization.append(getVectorConstructor(0 /* column */, 4));
		initialization.append(", ");
		initialization.append(getVectorConstructor(2 /* column */, 4));
		initialization.append("), ");
		initialization.append(getVectorConstructor(3 /* column */, 4));
		initialization.append(")");

		break;

	case NESTED_STRUCT_LIST:
		initialization = "{ { ";
		initialization.append(getVectorInitializer(0 /* column */, 4));
		initialization.append(", ");
		initialization.append(getVectorInitializer(2 /* column */, 4));
		initialization.append(" }, ");
		initialization.append(getVectorInitializer(3 /* column */, 4));
		initialization.append(" }");

		break;

	case NESTED_STURCT_ARRAYS_STRUCT_LIST:
		initialization = "{ ";
		initialization.append(getVectorInitializer(0 /* column */, 4));
		initialization.append(", { ");

		for (GLuint i = 0; i < 3; ++i)
		{
			initialization.append("{ ");
			initialization.append(getVectorInitializer(2 /* column */, 4));
			initialization.append(", ");
			initialization.append(getVectorInitializer(3 /* column */, 4));
			initialization.append(" }");

			if (i + 1 < 3)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" } }");

		break;

	case NESTED_STURCT_ARRAYS_STRUCT_MIX:
		initialization = "{ ";
		initialization.append(getVectorConstructor(0 /* column */, 4));
		initialization.append(", { ");

		for (GLuint i = 0; i < 3; ++i)
		{
			initialization.append("{ ");
			initialization.append(getVectorInitializer(2 /* column */, 4));
			initialization.append(", ");
			initialization.append(getVectorConstructor(3 /* column */, 4));
			initialization.append(" }");

			if (i + 1 < 3)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" } }");

		break;

	case NESTED_ARRAY_STRUCT_STRUCT_LIST:
		initialization = "{ ";

		for (GLuint i = 0; i < 4; ++i)
		{
			initialization.append("{ { ");

			initialization.append(getVectorInitializer(0 /* column */, 4));
			initialization.append(", ");
			initialization.append(getVectorInitializer(1 /* column */, 4));

			initialization.append(" }, ");

			initialization.append(getVectorInitializer(2 /* column */, 4));

			initialization.append(" }");

			if (i + 1 < 4)
			{
				initialization.append(", ");
			}
		}

		initialization.append(" }");

		break;

	case NESTED_ARRAY_STRUCT_STRUCT_MIX:
		initialization = "{\n";

		for (GLuint i = 0; i < 2; ++i)
		{
			initialization.append("StructureWithStructure(\n");
			initialization.append("BasicStructure(");

			initialization.append(getVectorConstructor(0 /* column */, 4));
			initialization.append(" , ");
			initialization.append(getVectorConstructor(1 /* column */, 4));

			initialization.append("), ");

			initialization.append(getVectorConstructor(2 /* column */, 4));

			initialization.append(")");

			initialization.append(" , ");

			initialization.append("{ { ");

			initialization.append(getVectorInitializer(0 /* column */, 4));
			initialization.append(", ");
			initialization.append(getVectorInitializer(1 /* column */, 4));

			initialization.append(" }, ");

			initialization.append(getVectorInitializer(2 /* column */, 4));

			initialization.append(" }");

			if (i + 1 < 2)
			{
				initialization.append(" , ");
			}
		}

		initialization.append(" }");

		break;

	case NESTED_STRUCT_STRUCT_ARRAY_LIST:
		initialization = "{ ";
		initialization.append("{ ");
		initialization.append(getVectorInitializer(0 /* column */, 4));
		initialization.append(", ");
		initialization.append("{ ");
		initialization.append(getVectorInitializer(1 /* column */, 4));
		initialization.append(", ");
		initialization.append(getVectorInitializer(2 /* column */, 4));
		initialization.append(" }");
		initialization.append(" }");
		initialization.append(", ");
		initialization.append(getVectorInitializer(3 /* column */, 4));
		initialization.append(" }");

		break;

	case NESTED_STRUCT_STRUCT_ARRAY_MIX:
		initialization = "StructureWithStructureWithArray(";
		initialization.append("StructureWithArray(");
		initialization.append(getVectorConstructor(0 /* column */, 4));
		initialization.append(" , vec4[2]( ");
		initialization.append(getVectorConstructor(1 /* column */, 4));
		initialization.append(" , ");
		initialization.append(getVectorConstructor(2 /* column */, 4));
		initialization.append(" )");
		initialization.append(")");
		initialization.append(" , ");
		initialization.append(getVectorConstructor(3 /* column */, 4));
		initialization.append(")");

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	return initialization;
}